

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O3

FieldType icu_63::GMTOffsetField::getTypeByLetter(UChar ch)

{
  undefined2 in_register_0000003a;
  int iVar1;
  
  iVar1 = CONCAT22(in_register_0000003a,ch);
  if (iVar1 == 0x48) {
    return HOUR;
  }
  if (iVar1 != 0x73) {
    if (iVar1 == 0x6d) {
      return MINUTE;
    }
    return TEXT;
  }
  return SECOND;
}

Assistant:

GMTOffsetField::FieldType
GMTOffsetField::getTypeByLetter(UChar ch) {
    if (ch == 0x0048 /* H */) {
        return HOUR;
    } else if (ch == 0x006D /* m */) {
        return MINUTE;
    } else if (ch == 0x0073 /* s */) {
        return SECOND;
    }
    return TEXT;
}